

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O1

void __thiscall
Js::DebugContext::WalkAndAddUtf8SourceInfo
          (DebugContext *this,Utf8SourceInfo *sourceInfo,
          List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
          *utf8SourceInfoList)

{
  ScriptContext *this_00;
  WriteBarrierPtr<Js::Utf8SourceInfo> *pWVar1;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  Utf8SourceInfo *pUVar7;
  ulong uVar8;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar9;
  undefined4 *puVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  Utf8SourceInfo *local_30;
  Utf8SourceInfo *sourceInfo_local;
  
  local_30 = sourceInfo;
  pUVar7 = Utf8SourceInfo::GetCallerUtf8SourceInfo(sourceInfo);
  if (pUVar7 != (Utf8SourceInfo *)0x0) {
    this_00 = (pUVar7->m_scriptContext).ptr;
    Output::Trace(DebuggerPhase,
                  L"DebugContext::WalkAndAddUtf8SourceInfo scriptContext 0x%p, sourceInfo 0x%p, callerUtf8SourceInfo 0x%p, sourceInfo scriptContext 0x%p, callerUtf8SourceInfo scriptContext 0x%p\n"
                  ,this->scriptContext,local_30,pUVar7,(local_30->m_scriptContext).ptr,this_00);
    if ((local_30->m_scriptContext).ptr == this_00) {
      WalkAndAddUtf8SourceInfo(this,pUVar7,utf8SourceInfoList);
    }
    else {
      bVar6 = ScriptContext::IsScriptContextInNonDebugMode(this_00);
      if (bVar6) {
        ScriptContext::AddCalleeSourceInfoToList(this_00,local_30);
      }
    }
  }
  uVar8 = (ulong)(utf8SourceInfoList->
                 super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>
                 ).count;
  bVar6 = 0 < (long)uVar8;
  if (0 < (long)uVar8) {
    pWVar1 = (utf8SourceInfoList->
             super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
             buffer.ptr;
    if (local_30 == pWVar1->ptr) {
      return;
    }
    uVar4 = 1;
    do {
      uVar13 = uVar4;
      if (uVar8 == uVar13) break;
      uVar4 = uVar13 + 1;
    } while (local_30 != pWVar1[uVar13].ptr);
    bVar6 = uVar13 < uVar8;
  }
  if (bVar6) {
    return;
  }
  Output::Trace(DebuggerPhase,
                L"DebugContext::WalkAndAddUtf8SourceInfo Adding to utf8SourceInfoList scriptContext 0x%p, sourceInfo 0x%p, sourceInfo scriptContext 0x%p\n"
                ,this->scriptContext);
  pLVar9 = Memory::
           RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
           ::operator->(&this->scriptContext->sourceList);
  lVar11 = (long)(pLVar9->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).count;
  if (0 < lVar11) {
    bVar12 = false;
    bVar6 = false;
    lVar14 = 0;
    do {
      pRVar2 = (pLVar9->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar14].ptr;
      bVar5 = bVar12;
      if (((ulong)pRVar2 & 1) == 0 && pRVar2 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) {
        pUVar7 = (Utf8SourceInfo *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef;
        bVar6 = bVar12;
        if (local_30 == pUVar7) {
          bVar6 = true;
        }
        bVar5 = bVar6;
        if (pUVar7 == (Utf8SourceInfo *)0x0) {
          bVar6 = bVar12;
          bVar5 = bVar12;
        }
      }
      bVar12 = bVar5;
      lVar14 = lVar14 + 1;
    } while (lVar11 != lVar14);
    if (bVar6) goto LAB_008b6527;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar10 = 1;
  bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                              ,0x1b0,"(found)","Parented eval feature have extra source");
  if (!bVar6) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar10 = 0;
LAB_008b6527:
  JsUtil::
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  ::Add(utf8SourceInfoList,&local_30);
  return;
}

Assistant:

void DebugContext::WalkAndAddUtf8SourceInfo(Js::Utf8SourceInfo* sourceInfo, JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer> *utf8SourceInfoList)
    {
        Js::Utf8SourceInfo* callerUtf8SourceInfo = sourceInfo->GetCallerUtf8SourceInfo();
        if (callerUtf8SourceInfo)
        {
            Js::ScriptContext* callerScriptContext = callerUtf8SourceInfo->GetScriptContext();
            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::WalkAndAddUtf8SourceInfo scriptContext 0x%p, sourceInfo 0x%p, callerUtf8SourceInfo 0x%p, sourceInfo scriptContext 0x%p, callerUtf8SourceInfo scriptContext 0x%p\n"),
                this->scriptContext, sourceInfo, callerUtf8SourceInfo, sourceInfo->GetScriptContext(), callerScriptContext);

            if (sourceInfo->GetScriptContext() == callerScriptContext)
            {
                WalkAndAddUtf8SourceInfo(callerUtf8SourceInfo, utf8SourceInfoList);
            }
            else if (callerScriptContext->IsScriptContextInNonDebugMode())
            {
                // The caller scriptContext is not in run down/debug mode so let's save the relationship so that we can re-parent callees afterwards.
                callerScriptContext->AddCalleeSourceInfoToList(sourceInfo);
            }
        }
        if (!utf8SourceInfoList->Contains(sourceInfo))
        {
            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::WalkAndAddUtf8SourceInfo Adding to utf8SourceInfoList scriptContext 0x%p, sourceInfo 0x%p, sourceInfo scriptContext 0x%p\n"),
                this->scriptContext, sourceInfo, sourceInfo->GetScriptContext());
#if DBG
            bool found = false;
            this->MapUTF8SourceInfoUntil([&](Js::Utf8SourceInfo * sourceInfoTemp) -> bool
            {
                if (sourceInfoTemp == sourceInfo)
                {
                    found = true;
                }
                return found;
            });
            AssertMsg(found, "Parented eval feature have extra source");
#endif
            utf8SourceInfoList->Add(sourceInfo);
        }
    }